

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

ly_err_item * ly_err_last(ly_ctx *ctx)

{
  ly_ctx_err_rec *plVar1;
  ly_err_item *plVar2;
  
  if (ctx == (ly_ctx *)0x0) {
    plVar2 = (ly_err_item *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","ly_err_last");
  }
  else {
    plVar1 = ly_err_get_rec(ctx);
    if ((plVar1 == (ly_ctx_err_rec *)0x0) || (plVar1->err == (ly_err_item *)0x0)) {
      plVar2 = (ly_err_item *)0x0;
    }
    else {
      plVar2 = plVar1->err->prev;
    }
  }
  return plVar2;
}

Assistant:

ly_err_item *
ly_err_last(const struct ly_ctx *ctx)
{
    struct ly_ctx_err_rec *rec;

    LY_CHECK_ARG_RET(NULL, ctx, NULL);

    /* get the pointer to the matching record */
    if (!(rec = ly_err_get_rec(ctx))) {
        return NULL;
    }

    return rec->err ? rec->err->prev : NULL;
}